

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_by_2.c
# Opt level: O3

void WebRtcSpl_UpsampleBy2(int16_t *in,size_t len,int16_t *out,int32_t *filtState)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  size_t sVar11;
  int32_t iVar12;
  int32_t iVar13;
  int iVar14;
  int32_t iVar15;
  
  iVar8 = *filtState;
  iVar10 = filtState[1];
  iVar4 = filtState[2];
  iVar1 = filtState[3];
  iVar15 = filtState[5];
  iVar12 = filtState[6];
  iVar6 = filtState[7];
  iVar7 = filtState[4];
  if (len != 0) {
    sVar11 = 0;
    iVar7 = iVar8;
    iVar9 = iVar10;
    iVar3 = iVar4;
    iVar13 = filtState[4];
    iVar2 = iVar15;
    iVar5 = iVar12;
    do {
      iVar8 = in[sVar11] * 0x400;
      iVar10 = ((iVar8 - iVar9 & 0xffffU) * 0xcd4 >> 0x10) + (iVar8 - iVar9 >> 0x10) * 0xcd4 + iVar7
      ;
      iVar4 = ((iVar10 - iVar3 & 0xffffU) * 0x5f79 >> 0x10) +
              (iVar10 - iVar3 >> 0x10) * 0x5f79 + iVar9;
      iVar1 = ((iVar4 - iVar1 & 0xffffU) * 0xc178 >> 0x10) +
              (iVar4 - iVar1 >> 0x10) * 0xc178 + iVar3;
      iVar14 = iVar1 + 0x200 >> 10;
      if (iVar14 < -0x7fff) {
        iVar14 = -0x8000;
      }
      if (0x7ffe < iVar14) {
        iVar14 = 0x7fff;
      }
      out[sVar11 * 2] = (int16_t)iVar14;
      iVar15 = ((iVar8 - iVar2 & 0xffffU) * 0x2fa7 >> 0x10) +
               (iVar8 - iVar2 >> 0x10) * 0x2fa7 + iVar13;
      iVar12 = ((iVar15 - iVar5 & 0xffffU) * 0x925f >> 0x10) +
               (iVar15 - iVar5 >> 0x10) * 0x925f + iVar2;
      iVar6 = ((iVar12 - iVar6 & 0xffffU) * 0xeb5f >> 0x10) +
              (iVar12 - iVar6 >> 0x10) * 0xeb5f + iVar5;
      iVar14 = iVar6 + 0x200 >> 10;
      if (iVar14 < -0x7fff) {
        iVar14 = -0x8000;
      }
      if (0x7ffe < iVar14) {
        iVar14 = 0x7fff;
      }
      out[sVar11 * 2 + 1] = (int16_t)iVar14;
      sVar11 = sVar11 + 1;
      iVar7 = iVar8;
      iVar9 = iVar10;
      iVar3 = iVar4;
      iVar13 = iVar8;
      iVar2 = iVar15;
      iVar5 = iVar12;
    } while (len != sVar11);
  }
  *filtState = iVar8;
  filtState[1] = iVar10;
  filtState[2] = iVar4;
  filtState[3] = iVar1;
  filtState[4] = iVar7;
  filtState[5] = iVar15;
  filtState[6] = iVar12;
  filtState[7] = iVar6;
  return;
}

Assistant:

void WebRtcSpl_UpsampleBy2(const int16_t* in, size_t len,
                           int16_t* out, int32_t* filtState) {
  int32_t tmp1, tmp2, diff, in32, out32;
  size_t i;

  register int32_t state0 = filtState[0];
  register int32_t state1 = filtState[1];
  register int32_t state2 = filtState[2];
  register int32_t state3 = filtState[3];
  register int32_t state4 = filtState[4];
  register int32_t state5 = filtState[5];
  register int32_t state6 = filtState[6];
  register int32_t state7 = filtState[7];

  for (i = len; i > 0; i--) {
    // lower allpass filter
    in32 = (int32_t)(*in++) << 10;
    diff = in32 - state1;
    tmp1 = MUL_ACCUM_1(kResampleAllpass1[0], diff, state0);
    state0 = in32;
    diff = tmp1 - state2;
    tmp2 = MUL_ACCUM_1(kResampleAllpass1[1], diff, state1);
    state1 = tmp1;
    diff = tmp2 - state3;
    state3 = MUL_ACCUM_2(kResampleAllpass1[2], diff, state2);
    state2 = tmp2;

    // round; limit amplitude to prevent wrap-around; write to output array
    out32 = (state3 + 512) >> 10;
    *out++ = WebRtcSpl_SatW32ToW16(out32);

    // upper allpass filter
    diff = in32 - state5;
    tmp1 = MUL_ACCUM_1(kResampleAllpass2[0], diff, state4);
    state4 = in32;
    diff = tmp1 - state6;
    tmp2 = MUL_ACCUM_2(kResampleAllpass2[1], diff, state5);
    state5 = tmp1;
    diff = tmp2 - state7;
    state7 = MUL_ACCUM_2(kResampleAllpass2[2], diff, state6);
    state6 = tmp2;

    // round; limit amplitude to prevent wrap-around; write to output array
    out32 = (state7 + 512) >> 10;
    *out++ = WebRtcSpl_SatW32ToW16(out32);
  }

  filtState[0] = state0;
  filtState[1] = state1;
  filtState[2] = state2;
  filtState[3] = state3;
  filtState[4] = state4;
  filtState[5] = state5;
  filtState[6] = state6;
  filtState[7] = state7;
}